

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::DetermineForwardDeclarations
          (MessageGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  pointer puVar1;
  Descriptor *pDVar2;
  FieldGenerator *pFVar3;
  long lVar4;
  long lVar5;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  pointer puVar6;
  
  if ((*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\0') &&
     (pDVar2 = this->descriptor_, 0 < *(int *)(pDVar2 + 4))) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar4));
      (*pFVar3->_vptr_FieldGenerator[7])(pFVar3,fwd_decls);
      lVar5 = lVar5 + 1;
      pDVar2 = this->descriptor_;
      lVar4 = lVar4 + 0x48;
    } while (lVar5 < *(int *)(pDVar2 + 4));
  }
  puVar1 = (this->nested_message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->nested_message_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    DetermineForwardDeclarations
              ((puVar6->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,fwd_decls);
  }
  return;
}

Assistant:

void MessageGenerator::DetermineForwardDeclarations(
    std::set<std::string>* fwd_decls) {
  if (!IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* fieldDescriptor = descriptor_->field(i);
      field_generators_.get(fieldDescriptor)
          .DetermineForwardDeclarations(fwd_decls);
    }
  }

  for (const auto& generator : nested_message_generators_) {
    generator->DetermineForwardDeclarations(fwd_decls);
  }
}